

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tableview.cpp
# Opt level: O2

void __thiscall
QtMWidgets::TableViewCellLayout::setTextGeometry
          (TableViewCellLayout *this,QRect *r,int imageOffset,int accessoryWidth)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  TextLabel *this_00;
  
  iVar2 = r->x1;
  iVar3 = r->x2;
  if (accessoryWidth < 1) {
    iVar1 = 0;
  }
  else {
    iVar1 = (**(code **)(*(long *)this + 0x60))(this);
  }
  iVar1 = (iVar3 - (accessoryWidth + imageOffset + iVar1 + iVar2)) + 1;
  iVar2 = (**(code **)(*(long *)this->textLabel + 0x80))(this->textLabel,iVar1);
  iVar3 = (**(code **)(*(long *)this->detailedTextLabel + 0x80))(this->detailedTextLabel,iVar1);
  if (iVar2 == 0 || iVar3 != 0) {
    if (iVar3 == 0 || iVar2 != 0) {
      if (iVar2 == 0 || iVar3 == 0) {
        return;
      }
      iVar4 = (r->y2 - r->y1) + 1;
      iVar6 = 0;
      iVar5 = iVar4 - (iVar3 + iVar2);
      if (iVar5 != 0 && iVar3 + iVar2 <= iVar4) {
        iVar6 = iVar5 / 2;
      }
      QWidget::setGeometry((QWidget *)this->textLabel,r->x1 + imageOffset,r->y1 + iVar6,iVar1,iVar2)
      ;
      this_00 = this->detailedTextLabel;
      iVar4 = imageOffset + r->x1;
      iVar2 = iVar2 + iVar6 + r->y1;
      goto LAB_0016db39;
    }
    iVar2 = (r->y2 - r->y1) + 1;
    iVar5 = 0;
    iVar4 = iVar2 - iVar3;
    if (iVar4 != 0 && iVar3 <= iVar2) {
      iVar5 = iVar4 / 2;
    }
    QWidget::setGeometry
              ((QWidget *)this->detailedTextLabel,imageOffset + r->x1,iVar5 + r->y1,iVar1,iVar3);
    this_00 = this->textLabel;
  }
  else {
    iVar3 = (r->y2 - r->y1) + 1;
    iVar5 = 0;
    iVar4 = iVar3 - iVar2;
    if (iVar4 != 0 && iVar2 <= iVar3) {
      iVar5 = iVar4 / 2;
    }
    QWidget::setGeometry((QWidget *)this->textLabel,imageOffset + r->x1,iVar5 + r->y1,iVar1,iVar2);
    this_00 = this->detailedTextLabel;
  }
  iVar4 = r->x1;
  iVar2 = r->y1;
  iVar1 = 0;
  iVar3 = 0;
LAB_0016db39:
  QWidget::setGeometry((QWidget *)this_00,iVar4,iVar2,iVar1,iVar3);
  return;
}

Assistant:

void
TableViewCellLayout::setTextGeometry( const QRect & r, int imageOffset,
	int accessoryWidth )
{
	const int width = r.width() - imageOffset - accessoryWidth -
		( accessoryWidth > 0 ? spacing() : 0 );
	const int textHeight = textLabel->heightForWidth( width );
	const int detailedTextHeight = detailedTextLabel->heightForWidth( width );

	if( detailedTextHeight == 0 && textHeight != 0 )
	{
		textLabel->setGeometry( r.x() + imageOffset, r.y() +
				( r.height() > textHeight ? ( r.height() - textHeight ) / 2 : 0 ),
			width, textHeight );
		detailedTextLabel->setGeometry( r.x(), r.y(), 0, 0 );
	}
	else if( textHeight == 0 && detailedTextHeight != 0 )
	{
		detailedTextLabel->setGeometry( r.x() + imageOffset, r.y() +
				( r.height() > detailedTextHeight ?
					( r.height() - detailedTextHeight ) / 2 : 0 ),
			width, detailedTextHeight );
		textLabel->setGeometry( r.x(), r.y(), 0, 0 );
	}
	else if( textHeight != 0 && detailedTextHeight != 0 )
	{
		const int h = ( r.height() > textHeight + detailedTextHeight ?
			( r.height() - textHeight - detailedTextHeight ) / 2 : 0 );
		textLabel->setGeometry( r.x() + imageOffset, r.y() + h,
			width, textHeight );
		detailedTextLabel->setGeometry( r.x() + imageOffset, r.y() + h +
			textHeight, width, detailedTextHeight );
	}
}